

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O2

int CfdGetAddressInfo(void *handle,char *address,int *network_type,int *hash_type,
                     int *witness_version,char **locking_script,char **hash)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  CfdException *pCVar5;
  allocator local_381;
  void *local_380;
  ElementsAddressFactory factory;
  char *work_locking_script;
  string local_348;
  undefined8 local_328;
  string err_msg;
  Address addr;
  
  local_328 = 0;
  local_380 = handle;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(address);
  if (bVar1) {
    addr._0_8_ = (long)
                 "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_address.cpp"
                 + 0x56;
    addr.witness_ver_ = 0x435;
    addr.address_._M_dataplus._M_p = "CfdGetAddressInfo";
    cfd::core::logger::warn<>((CfdSourceLocation *)&addr,"address is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&addr,"Failed to parameter. address is null.",(allocator *)&err_msg);
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&addr);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::Address::Address(&addr);
  cfd::ElementsAddressFactory::ElementsAddressFactory(&factory);
  std::__cxx11::string::string((string *)&local_348,address,&local_381);
  cfd::AddressFactory::GetAddress((Address *)&err_msg,&factory.super_AddressFactory,&local_348);
  cfd::core::Address::operator=(&addr,(Address *)&err_msg);
  cfd::core::Address::~Address((Address *)&err_msg);
  std::__cxx11::string::~string((string *)&local_348);
  cfd::AddressFactory::~AddressFactory(&factory.super_AddressFactory);
  cfd::core::Address::GetAddress_abi_cxx11_(&err_msg,&addr);
  std::__cxx11::string::~string((string *)&err_msg);
  if (CONCAT44(err_msg._M_string_length._4_4_,(undefined4)err_msg._M_string_length) == 0) {
    cfd::AddressFactory::AddressFactory(&factory.super_AddressFactory);
    std::__cxx11::string::string((string *)&local_348,address,&local_381);
    cfd::AddressFactory::GetAddress((Address *)&err_msg,&factory.super_AddressFactory,&local_348);
    cfd::core::Address::operator=(&addr,(Address *)&err_msg);
    cfd::core::Address::~Address((Address *)&err_msg);
    std::__cxx11::string::~string((string *)&local_348);
    cfd::AddressFactory::~AddressFactory(&factory.super_AddressFactory);
  }
  if (network_type != (int *)0x0) {
    if ((addr._0_8_ & 0xffffffff) < 5) {
      iVar2 = *(int *)(&DAT_004fa9b4 + (addr._0_8_ & 0xffffffff) * 4);
    }
    else {
      iVar2 = 0xc;
    }
    *network_type = iVar2;
  }
  if (hash_type != (int *)0x0) {
    if (7 < addr.addr_type_ - kP2shAddress) {
      err_msg._M_dataplus._M_p = "cfdcapi_address.cpp";
      err_msg._M_string_length._0_4_ = 0x481;
      err_msg.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_70c03c;
      factory.super_AddressFactory._vptr_AddressFactory._0_4_ = addr.addr_type_;
      cfd::core::logger::warn<cfd::core::AddressType>
                ((CfdSourceLocation *)&err_msg,"Illegal hash type.({})",(AddressType *)&factory);
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&err_msg,"Illegal hash type.",(allocator *)&factory);
      cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&err_msg);
      __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    *hash_type = *(int *)(&DAT_004fa9c8 + (ulong)(addr.addr_type_ - kP2shAddress) * 4);
  }
  if (witness_version != (int *)0x0) {
    *witness_version = addr.witness_ver_;
  }
  cfd::core::Address::GetLockingScript((Script *)&err_msg,&addr);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&factory,(Script *)&err_msg);
  pcVar3 = cfd::capi::CreateString((string *)&factory);
  std::__cxx11::string::~string((string *)&factory);
  cfd::core::Script::~Script((Script *)&err_msg);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&factory,&addr.hash_.data_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&err_msg,(ByteData *)&factory);
  pcVar4 = cfd::capi::CreateString(&err_msg);
  std::__cxx11::string::~string((string *)&err_msg);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&factory);
  if (locking_script != (char **)0x0) {
    *locking_script = pcVar3;
  }
  if (hash != (char **)0x0) {
    *hash = pcVar4;
  }
  cfd::core::Address::~Address(&addr);
  return 0;
}

Assistant:

int CfdGetAddressInfo(
    void* handle, const char* address, int* network_type, int* hash_type,
    int* witness_version, char** locking_script, char** hash) {
  int error_code = CfdErrorCode::kCfdUnknownError;
  char* work_locking_script = nullptr;
  char* work_hash = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(address)) {
      warn(CFD_LOG_SOURCE, "address is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. address is null.");
    }

    Address addr;
#ifndef CFD_DISABLE_ELEMENTS
    try {
      ElementsAddressFactory factory;
      addr = factory.GetAddress(address);
    } catch (const CfdException& cfd_except) {
      std::string err_msg = cfd_except.what();
      if ((err_msg != "Base58 decode error.") &&
          (err_msg != "Unknown address prefix.")) {
        throw cfd_except;
      }
    }
#endif  // CFD_DISABLE_ELEMENTS

    if (addr.GetAddress().empty()) {
      AddressFactory factory;
      addr = factory.GetAddress(address);
    }

    if (network_type != nullptr) {
      switch (addr.GetNetType()) {
        case NetType::kMainnet:
          *network_type = kCfdNetworkMainnet;
          break;
        case NetType::kTestnet:
          *network_type = kCfdNetworkTestnet;
          break;
        case NetType::kRegtest:
          *network_type = kCfdNetworkRegtest;
          break;
        case NetType::kLiquidV1:
          *network_type = kCfdNetworkLiquidv1;
          break;
        case NetType::kElementsRegtest:
          *network_type = kCfdNetworkElementsRegtest;
          break;
        default:
          *network_type = kCfdNetworkCustomChain;
          break;
      }
    }

    if (hash_type != nullptr) {
      switch (addr.GetAddressType()) {
        case AddressType::kP2shAddress:
          *hash_type = kCfdP2sh;
          break;
        case AddressType::kP2pkhAddress:
          *hash_type = kCfdP2pkh;
          break;
        case AddressType::kP2wshAddress:
          *hash_type = kCfdP2wsh;
          break;
        case AddressType::kP2wpkhAddress:
          *hash_type = kCfdP2wpkh;
          break;
        case AddressType::kP2shP2wshAddress:
          *hash_type = kCfdP2shP2wsh;
          break;
        case AddressType::kP2shP2wpkhAddress:
          *hash_type = kCfdP2shP2wpkh;
          break;
        case AddressType::kTaprootAddress:
          *hash_type = kCfdTaproot;
          break;
        case AddressType::kWitnessUnknown:
          *hash_type = kCfdUnknown;
          break;
        default:
          warn(
              CFD_LOG_SOURCE, "Illegal hash type.({})", addr.GetAddressType());
          throw CfdException(
              CfdError::kCfdIllegalArgumentError, "Illegal hash type.");
      }
    }

    if (witness_version != nullptr) {
      *witness_version = static_cast<int>(addr.GetWitnessVersion());
    }
    work_locking_script = CreateString(addr.GetLockingScript().GetHex());
    work_hash = CreateString(addr.GetHash().GetHex());

    if (locking_script != nullptr) {
      *locking_script = work_locking_script;
    }
    if (hash != nullptr) {
      *hash = work_hash;
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    error_code = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_locking_script, &work_hash);
  return error_code;
}